

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_file.c
# Opt level: O0

guint16 * swap_read_pgm(char *name,size_t *w,size_t *h)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  guint16 *__ptr;
  size_t sVar4;
  long *in_RDX;
  long *in_RSI;
  char *in_RDI;
  guint16 *ret;
  int maxval;
  int height;
  int width;
  int isize;
  int len;
  int i;
  int c;
  FILE *f;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  FILE *local_28;
  long *local_20;
  long *local_18;
  char *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = fopen(in_RDI,"rb");
  if (local_28 == (FILE *)0x0) {
    piVar2 = __errno_location();
    uVar3 = g_strerror(*piVar2);
    _p2sc_msg("swap_read_pgm",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
              ,0x181,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x1068,"%s: %s",local_10,
              uVar3);
    exit(1);
  }
  local_2c = fgetc(local_28);
  if (local_2c != 0x50) {
    _p2sc_msg("swap_read_pgm",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
              ,0x185,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
              "%s: expected P, got %d",local_10,
              CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),local_2c));
    exit(1);
  }
  local_2c = fgetc(local_28);
  if (local_2c != 0x35) {
    _p2sc_msg("swap_read_pgm",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
              ,0x188,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
              "%s: expected 5, got %d",local_10,
              CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),local_2c));
    exit(1);
  }
  blank((FILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
        in_stack_ffffffffffffff90);
  iVar1 = __isoc99_fscanf(local_28,"%d",&local_3c);
  if (iVar1 == 1) {
    blank((FILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
          in_stack_ffffffffffffff90);
    iVar1 = __isoc99_fscanf(local_28,"%d",&local_40);
    if (iVar1 != 1) {
      _p2sc_msg("swap_read_pgm",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
                ,0x18e,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
                "%s: failed read of height",local_10);
      exit(1);
    }
    blank((FILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
          in_stack_ffffffffffffff90);
    iVar1 = __isoc99_fscanf(local_28,"%d",&local_44);
    if (iVar1 == 1) {
      blank((FILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
            in_stack_ffffffffffffff90);
      if ((((0 < local_3c) && (0 < local_40)) && (0 < local_44)) &&
         (((local_3c < 0x8000 && (local_40 < 0x8000)) && (local_44 < 0x10000)))) {
        local_34 = local_3c * local_40;
        __ptr = (guint16 *)g_malloc((long)local_34 << 1);
        if (local_44 < 0x100) {
          local_38 = 1;
        }
        else {
          local_38 = 2;
        }
        sVar4 = fread(__ptr,(long)(local_34 * local_38),1,local_28);
        if (sVar4 != 1) {
          _p2sc_msg("swap_read_pgm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
                    ,0x1a3,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0xce4,
                    "fread(%s): failed",local_10);
        }
        fclose(local_28);
        local_30 = local_34;
        if (local_38 == 2) {
          for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
            __ptr[local_30] = __ptr[local_30] >> 8 | __ptr[local_30] << 8;
          }
        }
        else {
          while (local_30 = local_30 + -1, -1 < local_30) {
            __ptr[local_30] = (ushort)*(byte *)((long)__ptr + (long)local_30);
          }
        }
        *local_18 = (long)local_3c;
        *local_20 = (long)local_40;
        return __ptr;
      }
      _p2sc_msg("swap_read_pgm",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
                ,0x198,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
                "%s: invalid image - width = %d, height = %d, maxval = %d",local_10,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),local_3c),local_40,local_44
               );
      exit(1);
    }
    _p2sc_msg("swap_read_pgm",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
              ,0x191,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
              "%s: failed read of maxval",local_10);
    exit(1);
  }
  _p2sc_msg("swap_read_pgm",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
            ,0x18b,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
            "%s: failed read of width",local_10);
  exit(1);
}

Assistant:

guint16 *swap_read_pgm(const char *name, size_t *w, size_t *h) {
    FILE *f;
    int c, i, len, isize, width, height, maxval;

    guint16 *ret = NULL;

    if (!(f = fopen(name, "rb")))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: %s", name, g_strerror(errno));

    c = fgetc(f);
    if (c != 'P')
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: expected P, got %d", name, c);
    c = fgetc(f);
    if (c != '5')
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: expected 5, got %d", name, c);
    blank(f, name);
    if (fscanf(f, "%d", &width) != 1)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: failed read of width", name);
    blank(f, name);
    if (fscanf(f, "%d", &height) != 1)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: failed read of height", name);
    blank(f, name);
    if (fscanf(f, "%d", &maxval) != 1)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: failed read of maxval", name);
    blank(f, name);

    if (width <= 0 || height <= 0 || maxval <= 0 ||
        width > 32767 || height > 32767 || maxval > 65535)
        P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA,
                 "%s: invalid image - width = %d, height = %d, maxval = %d",
                 name, width, height, maxval);

    len = width * height;
    ret = (guint16 *) g_malloc(len * sizeof *ret);

    if (maxval < 256)
        isize = 1;
    else
        isize = 2;

    if (fread(ret, len * isize, 1, f) != 1)
        P2SC_Msg(LVL_WARNING_CORRUPT_INPUT_DATA, "fread(%s): failed", name);
    fclose(f);

    if (isize == 2)
        for (i = 0; i < len; ++i)
            ret[i] = GUINT16_FROM_BE(ret[i]);
    else
        for (i = len - 1; i >= 0; --i)
            ret[i] = ((guint8 *) ret)[i];

    *w = width;
    *h = height;

    return ret;
}